

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<4>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  unsigned_long *puVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  puVar1 = Get<unsigned_long>(ptr);
  io::CodedOutputStream::WriteVarint64(output,*puVar1);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt64NoTag(Get<uint64>(ptr), output);
  }